

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O2

CURLcode Curl_pp_readresp(curl_socket_t sockfd,pingpong *pp,int *code,size_t *size)

{
  long *plVar1;
  ulong uVar2;
  char *__src;
  bool bVar3;
  _Bool _Var4;
  CURLcode CVar5;
  CURLcode CVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  Curl_easy *data;
  size_t size_00;
  ulong uVar10;
  connectdata *pcVar11;
  ssize_t gotbytes;
  connectdata *local_68;
  curl_socket_t local_5c;
  char *local_58;
  Curl_easy *local_50;
  size_t *local_48;
  char *local_40;
  int *local_38;
  
  pcVar11 = pp->conn;
  data = pcVar11->data;
  local_58 = (data->state).buffer;
  *code = 0;
  *size = 0;
  uVar10 = pp->nread_resp;
  pcVar7 = local_58 + uVar10;
  size_00 = (long)pcVar7 - (long)pp->linestart_resp;
  local_40 = local_58 + 1;
  bVar3 = true;
  CVar6 = CURLE_OK;
  local_68 = pcVar11;
  local_5c = sockfd;
  local_50 = data;
  local_48 = size;
  local_38 = code;
  do {
    uVar2 = (data->set).buffer_size;
    if (((uVar2 < uVar10 || uVar2 - uVar10 == 0) || (!bVar3)) || (CVar6 != CURLE_OK)) {
      pp->pending_resp = false;
      return CVar6;
    }
    if (pp->cache == (char *)0x0) {
      CVar5 = Curl_read(pcVar11,local_5c,pcVar7,uVar2 - uVar10,&gotbytes);
      if (CVar5 == CURLE_AGAIN) {
        return CURLE_OK;
      }
      CVar6 = CVar5;
      if (0 < gotbytes) {
        CVar6 = CURLE_OK;
      }
      if (CVar5 != CURLE_OK) {
        CVar6 = CVar5;
      }
      if (CVar6 != CURLE_OK) {
        bVar3 = false;
      }
    }
    else {
      if (local_40 + uVar2 < pcVar7 + pp->cache_size) {
        Curl_failf(data,"cached response data too big to handle");
        return CURLE_RECV_ERROR;
      }
      memcpy(pcVar7,pp->cache,pp->cache_size);
      gotbytes = pp->cache_size;
      (*Curl_cfree)(pp->cache);
      pp->cache = (char *)0x0;
      pp->cache_size = 0;
      CVar6 = CURLE_OK;
    }
    if (bVar3) {
      if (gotbytes < 1) {
        bVar3 = false;
        Curl_failf(data,"response reading failed");
        CVar6 = CURLE_RECV_ERROR;
      }
      else {
        plVar1 = &(data->req).headerbytecount;
        *plVar1 = *plVar1 + gotbytes;
        pp->nread_resp = pp->nread_resp + gotbytes;
        sVar8 = gotbytes;
        for (uVar10 = 0; (long)uVar10 < (long)sVar8; uVar10 = uVar10 + 1) {
          size_00 = size_00 + 1;
          if (pcVar7[uVar10] == '\n') {
            pcVar9 = pp->linestart_resp;
            if ((data->set).verbose == true) {
              Curl_debug(data,CURLINFO_HEADER_IN,pcVar9,size_00);
              pcVar9 = pp->linestart_resp;
            }
            pcVar11 = local_68;
            CVar6 = Curl_client_write(local_68,2,pcVar9,size_00);
            if (CVar6 != CURLE_OK) {
              return CVar6;
            }
            _Var4 = (*pp->endofresp)(pcVar11,pp->linestart_resp,size_00,local_38);
            pcVar9 = local_58;
            if (_Var4) {
              __src = pp->linestart_resp;
              memmove(local_58,__src,(size_t)(pcVar7 + (uVar10 - (long)__src)));
              pcVar9[(long)(pcVar7 + (uVar10 - (long)__src))] = '\0';
              pp->linestart_resp = pcVar7 + uVar10 + 1;
              *local_48 = pp->nread_resp;
              pp->nread_resp = 0;
              CVar6 = CURLE_OK;
              bVar3 = false;
              data = local_50;
              if (gotbytes - 1U == uVar10) goto LAB_001344e2;
              size_00 = ~uVar10 + gotbytes;
              CVar6 = CURLE_OK;
              goto LAB_001344b5;
            }
            pp->linestart_resp = pcVar7 + uVar10 + 1;
            size_00 = 0;
            CVar6 = CURLE_OK;
            sVar8 = gotbytes;
            data = local_50;
          }
        }
        uVar2 = (data->set).buffer_size;
        if ((size_00 == sVar8) && ((long)uVar2 / 2 < (long)sVar8)) {
          Curl_infof(data,"Excessive server response line length received, %zd bytes. Stripping\n",
                     sVar8);
          size_00 = 0x28;
LAB_001344ba:
          pp->cache_size = size_00;
          pcVar7 = (char *)(*Curl_cmalloc)(size_00);
          pp->cache = pcVar7;
          if (pcVar7 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          memcpy(pcVar7,pp->linestart_resp,pp->cache_size);
        }
        else {
          if (pp->nread_resp <= uVar2 >> 1) {
            pcVar7 = pcVar7 + uVar10;
            pcVar11 = local_68;
            goto LAB_001344fc;
          }
LAB_001344b5:
          if (size_00 != 0) goto LAB_001344ba;
        }
LAB_001344e2:
        pp->nread_resp = 0;
        pp->linestart_resp = local_58;
        size_00 = 0;
        pcVar7 = local_58;
        pcVar11 = local_68;
      }
    }
LAB_001344fc:
    uVar10 = pp->nread_resp;
  } while( true );
}

Assistant:

CURLcode Curl_pp_readresp(curl_socket_t sockfd,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  ssize_t perline; /* count bytes per line */
  bool keepon = TRUE;
  ssize_t gotbytes;
  char *ptr;
  struct connectdata *conn = pp->conn;
  struct Curl_easy *data = conn->data;
  char * const buf = data->state.buffer;
  CURLcode result = CURLE_OK;

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  ptr = buf + pp->nread_resp;

  /* number of bytes in the current line, so far */
  perline = (ssize_t)(ptr-pp->linestart_resp);

  while((pp->nread_resp < (size_t)data->set.buffer_size) &&
        (keepon && !result)) {

    if(pp->cache) {
      /* we had data in the "cache", copy that instead of doing an actual
       * read
       *
       * pp->cache_size is cast to ssize_t here.  This should be safe, because
       * it would have been populated with something of size int to begin
       * with, even though its datatype may be larger than an int.
       */
      if((ptr + pp->cache_size) > (buf + data->set.buffer_size + 1)) {
        failf(data, "cached response data too big to handle");
        return CURLE_RECV_ERROR;
      }
      memcpy(ptr, pp->cache, pp->cache_size);
      gotbytes = (ssize_t)pp->cache_size;
      free(pp->cache);    /* free the cache */
      pp->cache = NULL;   /* clear the pointer */
      pp->cache_size = 0; /* zero the size just in case */
    }
    else {
#ifdef HAVE_GSSAPI
      enum protection_level prot = conn->data_prot;
      conn->data_prot = PROT_CLEAR;
#endif
      DEBUGASSERT((ptr + data->set.buffer_size - pp->nread_resp) <=
                  (buf + data->set.buffer_size + 1));
      result = Curl_read(conn, sockfd, ptr,
                         data->set.buffer_size - pp->nread_resp,
                         &gotbytes);
#ifdef HAVE_GSSAPI
      DEBUGASSERT(prot  > PROT_NONE && prot < PROT_LAST);
      conn->data_prot = prot;
#endif
      if(result == CURLE_AGAIN)
        return CURLE_OK; /* return */

      if(!result && (gotbytes > 0))
        /* convert from the network encoding */
        result = Curl_convert_from_network(data, ptr, gotbytes);
      /* Curl_convert_from_network calls failf if unsuccessful */

      if(result)
        /* Set outer result variable to this error. */
        keepon = FALSE;
    }

    if(!keepon)
      ;
    else if(gotbytes <= 0) {
      keepon = FALSE;
      result = CURLE_RECV_ERROR;
      failf(data, "response reading failed");
    }
    else {
      /* we got a whole chunk of data, which can be anything from one
       * byte to a set of lines and possible just a piece of the last
       * line */
      ssize_t i;
      ssize_t clipamount = 0;
      bool restart = FALSE;

      data->req.headerbytecount += (long)gotbytes;

      pp->nread_resp += gotbytes;
      for(i = 0; i < gotbytes; ptr++, i++) {
        perline++;
        if(*ptr == '\n') {
          /* a newline is CRLF in pp-talk, so the CR is ignored as
             the line isn't really terminated until the LF comes */

          /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
          if(!conn->sec_complete)
#endif
            if(data->set.verbose)
              Curl_debug(data, CURLINFO_HEADER_IN,
                         pp->linestart_resp, (size_t)perline);

          /*
           * We pass all response-lines to the callback function registered
           * for "headers". The response lines can be seen as a kind of
           * headers.
           */
          result = Curl_client_write(conn, CLIENTWRITE_HEADER,
                                     pp->linestart_resp, perline);
          if(result)
            return result;

          if(pp->endofresp(conn, pp->linestart_resp, perline, code)) {
            /* This is the end of the last line, copy the last line to the
               start of the buffer and zero terminate, for old times sake */
            size_t n = ptr - pp->linestart_resp;
            memmove(buf, pp->linestart_resp, n);
            buf[n] = 0; /* zero terminate */
            keepon = FALSE;
            pp->linestart_resp = ptr + 1; /* advance pointer */
            i++; /* skip this before getting out */

            *size = pp->nread_resp; /* size of the response */
            pp->nread_resp = 0; /* restart */
            break;
          }
          perline = 0; /* line starts over here */
          pp->linestart_resp = ptr + 1;
        }
      }

      if(!keepon && (i != gotbytes)) {
        /* We found the end of the response lines, but we didn't parse the
           full chunk of data we have read from the server. We therefore need
           to store the rest of the data to be checked on the next invoke as
           it may actually contain another end of response already! */
        clipamount = gotbytes - i;
        restart = TRUE;
        DEBUGF(infof(data, "Curl_pp_readresp_ %d bytes of trailing "
                     "server response left\n",
                     (int)clipamount));
      }
      else if(keepon) {

        if((perline == gotbytes) && (gotbytes > data->set.buffer_size/2)) {
          /* We got an excessive line without newlines and we need to deal
             with it. We keep the first bytes of the line then we throw
             away the rest. */
          infof(data, "Excessive server response line length received, "
                "%zd bytes. Stripping\n", gotbytes);
          restart = TRUE;

          /* we keep 40 bytes since all our pingpong protocols are only
             interested in the first piece */
          clipamount = 40;
        }
        else if(pp->nread_resp > (size_t)data->set.buffer_size/2) {
          /* We got a large chunk of data and there's potentially still
             trailing data to take care of, so we put any such part in the
             "cache", clear the buffer to make space and restart. */
          clipamount = perline;
          restart = TRUE;
        }
      }
      else if(i == gotbytes)
        restart = TRUE;

      if(clipamount) {
        pp->cache_size = clipamount;
        pp->cache = malloc(pp->cache_size);
        if(pp->cache)
          memcpy(pp->cache, pp->linestart_resp, pp->cache_size);
        else
          return CURLE_OUT_OF_MEMORY;
      }
      if(restart) {
        /* now reset a few variables to start over nicely from the start of
           the big buffer */
        pp->nread_resp = 0; /* start over from scratch in the buffer */
        ptr = pp->linestart_resp = buf;
        perline = 0;
      }

    } /* there was data */

  } /* while there's buffer left and loop is requested */

  pp->pending_resp = FALSE;

  return result;
}